

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O3

string * __thiscall
bgui::ImageAdapter<unsigned_char>::getDescriptionOfPixel_abi_cxx11_
          (string *__return_storage_ptr__,ImageAdapter<unsigned_char> *this,long x,long y)

{
  double dVar1;
  bool bVar2;
  ostream *poVar3;
  bool bVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ostringstream os;
  long local_1d0;
  long local_1c8;
  long local_1c0 [3];
  long local_1a8 [2];
  undefined8 auStack_198 [12];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  dVar1 = (this->super_ImageAdapterBase).scale;
  local_1c0[0] = (long)((double)x / dVar1);
  local_1c0[1] = (long)((double)y / dVar1);
  local_1c0[2] = 1;
  lVar6 = 0;
  local_1c8 = 0;
  local_1d0 = 0;
  plVar5 = &local_1c8;
  bVar2 = true;
  do {
    bVar4 = bVar2;
    lVar7 = *plVar5;
    lVar8 = 0;
    do {
      lVar7 = lVar7 + local_1c0[lVar8] * (this->super_ImageAdapterBase).R.v[lVar6][lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    *plVar5 = lVar7;
    lVar6 = 1;
    plVar5 = &local_1d0;
    bVar2 = false;
  } while (bVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"x=",2);
  lVar7 = local_1c8;
  *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 5;
  poVar3 = std::ostream::_M_insert<long>((long)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", y=",4);
  lVar6 = local_1d0;
  *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 5;
  poVar3 = std::ostream::_M_insert<long>((long)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
  if (0 < this->image->depth) {
    lVar8 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      *(undefined8 *)((long)auStack_198 + *(long *)(local_1a8[0] + -0x18)) = 5;
      std::ostream::operator<<((ostream *)local_1a8,(uint)this->image->img[lVar8][lVar6][lVar7]);
      lVar8 = lVar8 + 1;
    } while (lVar8 < this->image->depth);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string getDescriptionOfPixel(long x, long y) const
    {
      std::ostringstream os;

      x=static_cast<long>(x/scale);
      y=static_cast<long>(y/scale);

      gmath::SVector<long, 2> p=R*gmath::SVector<long, 3>(x, y, 1);

      os << "x=";

      os.width(5);
      os << p[0] << ", y=";

      os.width(5);
      os << p[1] << ":";

      for (int d=0; d<image->getDepth(); d++)
      {
        os << " ";

        os.width(5);
        os << image->getW(p[0], p[1], d);
      }

      return os.str();
    }